

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O1

int zt_opt_process_args(int *argc,char **argv,zt_opt_def_t *args,zt_opt_validate validate,
                       zt_opt_error error)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  code *pcVar5;
  zt_opt_def_t *pzVar6;
  size_t sVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  zt_opt_callback p_Var12;
  size_t __n;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  int local_54;
  int local_40;
  
  pcVar5 = _zt_opt_error_wrapper;
  if (error != (zt_opt_error)0x0) {
    pcVar5 = error;
  }
  if (validate == (zt_opt_validate)0x0) {
    validate = zt_opt_validate_default;
  }
  (*validate)(args,pcVar5);
  uVar11 = 1;
  uVar10 = 1;
  if (1 < *argc) {
    do {
      uVar10 = (uint)uVar11;
      pcVar13 = argv[uVar11];
      if (*pcVar13 != '-') break;
      cVar1 = pcVar13[1];
      if (cVar1 == '-') {
        pcVar13 = pcVar13 + 2;
        for (__n = 0; (cVar8 = pcVar13[__n], cVar8 != '\0' && (cVar8 != '=')); __n = __n + 1) {
        }
        bVar15 = cVar8 != '=';
      }
      else {
        pcVar13 = pcVar13 + 1;
        bVar15 = true;
        __n = 0;
      }
      bVar3 = false;
      do {
        local_54 = (int)uVar11;
        p_Var12 = args->cb;
        if (p_Var12 == (zt_opt_callback)0x0) goto LAB_001049b9;
        uVar14 = 0;
        pzVar6 = args;
        while ((((__n != 0 || (pzVar6->sopt == -1)) || (*pcVar13 != pzVar6->sopt)) &&
               (((pcVar2 = pzVar6->lopt, pcVar2 == (char *)0x0 ||
                 (sVar7 = strlen(pcVar2), sVar7 != __n)) ||
                (iVar4 = strncmp(pcVar13,pcVar2,__n), iVar4 != 0))))) {
          uVar14 = (ulong)((int)uVar14 + 1);
          pzVar6 = args + uVar14;
          p_Var12 = args[uVar14].cb;
          if (p_Var12 == (zt_opt_callback)0x0) goto LAB_001049b9;
        }
        iVar4 = (*p_Var12)(local_54,(int)uVar14,argc,argv,args,pcVar5);
        bVar3 = true;
        if (iVar4 < 0) {
          cVar8 = '\x01';
          local_40 = iVar4;
        }
        else {
          iVar9 = 0;
          if (bVar15) {
            iVar9 = iVar4;
          }
          uVar11 = (ulong)(uint)(local_54 + iVar9);
          cVar8 = '\t';
          if ((cVar1 != '-') && (iVar4 == 0)) {
            pcVar2 = pcVar13 + 1;
            pcVar13 = pcVar13 + 1;
            cVar8 = (*pcVar2 == '\0') + '\b';
          }
        }
      } while (cVar8 == '\b');
      local_54 = (int)uVar11;
      if (cVar8 == '\t') {
LAB_001049b9:
        bVar15 = true;
        if (!bVar3) {
          (*pcVar5)(0x16,"\'%.*s\'",__n + (__n == 0),pcVar13);
        }
      }
      else {
        bVar15 = false;
      }
      if (!bVar15) {
        return local_40;
      }
      uVar10 = local_54 + 1;
      uVar11 = (ulong)uVar10;
    } while ((int)uVar10 < *argc);
  }
  *argc = uVar10;
  return 0;
}

Assistant:

int
zt_opt_process_args(int * argc, char ** argv, zt_opt_def_t * args, zt_opt_validate validate, zt_opt_error error) {
    int i;

    error    = error ? error : _zt_opt_error_wrapper;
    validate = validate ? validate : zt_opt_validate_default;

    validate(args, error);

    for (i = 1; i < *argc; i++) {
        if (argv[i][0] == '-') {
            unsigned int x;
            size_t       len          = 0;
            char       * p            = &argv[i][1];
            int          combined_opt = 0;
            int          found        = 0;
            int          long_opt     = 0;

            if (*p == '-') { /* long opt */
                long_opt = 1;
                ++p;
                for (len = 0; p[len] != '\0' && p[len] != '='; len++) {
                    ;
                }

                if (p[len] == '=') {
                    combined_opt = 1;
                }
            }


AGAIN:
            for (x = 0; args[x].cb; x++) {
                if ((len == 0 && args[x].sopt != ZT_OPT_NSO && *p == args[x].sopt) || /* short opt */
                    /* long opt */
                    (args[x].lopt != ZT_OPT_NLO && strlen(args[x].lopt) == len &&
                     strncmp(p, args[x].lopt, len) == 0)) {
                    int consumed = 0;

                    found = 1;
                    if ((consumed = args[x].cb(i, x, argc, argv, args, error)) < 0) {
                        /* error */
                        return consumed;
                    }

                    if (!combined_opt) {
                        i += consumed;
                    }

                    if(!consumed && !long_opt && *(++p)) {
                        /* if we did not consume extra args AND
                         * we are a short option AND
                         * there are more short options to consume
                         */
                        goto AGAIN;
                    }

                    break;
                }
            }

            if (!found) {
                error(EINVAL, "'%.*s'", len ? len : 1, p);
            }
        } else {
            break;
        }
    }

    *argc = i;

    return 0;
}